

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

int Gia_ObjGetCnfVar(Gia_Man_t *pGia,int iObj,Vec_Ptr_t *vFrontier,Vec_Ptr_t *vFanins,satoko_t *pSat
                    )

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  Gia_Obj_t *pGVar3;
  int iVar;
  int fUseMuxes;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pNode;
  satoko_t *pSat_local;
  Vec_Ptr_t *vFanins_local;
  Vec_Ptr_t *vFrontier_local;
  int iObj_local;
  Gia_Man_t *pGia_local;
  
  pObj_00 = Gia_ManObj(pGia,iObj);
  iVar1 = Vec_IntSize(&pGia->vCopies2);
  iVar2 = Gia_ManObjNum(pGia);
  if (iVar1 < iVar2) {
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFillExtra(&pGia->vCopies2,iVar1,-1);
  }
  iVar1 = Cec2_ObjSatId(pGia,pObj_00);
  if (iVar1 < 0) {
    if (iObj < 1) {
      __assert_fail("iObj > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0x14a,
                    "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)");
    }
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x155,
                      "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      Vec_PtrClear(vFrontier);
      Cec2_ObjAddToFrontier(pGia,pObj_00,vFrontier,pSat);
      for (fUseMuxes = 0; iVar1 = Vec_PtrSize(vFrontier), fUseMuxes < iVar1;
          fUseMuxes = fUseMuxes + 1) {
        pObj_01 = (Gia_Obj_t *)Vec_PtrEntry(vFrontier,fUseMuxes);
        iVar1 = Cec2_ObjSatId(pGia,pObj_01);
        if (iVar1 < 0) {
          __assert_fail("Cec2_ObjSatId(pGia,pNode) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x15d,
                        "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
        if ((*(ulong *)pObj_01 >> 0x1e & 1) == 0) {
          Cec2_CollectSuper(pGia,pObj_01,1,vFanins);
          for (iVar = 0; iVar1 = Vec_PtrSize(vFanins), iVar < iVar1; iVar = iVar + 1) {
            pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(vFanins,iVar);
            pGVar3 = Gia_Regular(pGVar3);
            Cec2_ObjAddToFrontier(pGia,pGVar3,vFrontier,pSat);
          }
          Cec2_AddClausesSuper(pGia,pObj_01,vFanins,pSat);
        }
        else {
          Vec_PtrClear(vFanins);
          pGVar3 = Gia_ObjFanin0(pObj_01);
          pGVar3 = Gia_ObjFanin0(pGVar3);
          Vec_PtrPushUnique(vFanins,pGVar3);
          pGVar3 = Gia_ObjFanin1(pObj_01);
          pGVar3 = Gia_ObjFanin0(pGVar3);
          Vec_PtrPushUnique(vFanins,pGVar3);
          pGVar3 = Gia_ObjFanin0(pObj_01);
          pGVar3 = Gia_ObjFanin1(pGVar3);
          Vec_PtrPushUnique(vFanins,pGVar3);
          pGVar3 = Gia_ObjFanin1(pObj_01);
          pGVar3 = Gia_ObjFanin1(pGVar3);
          Vec_PtrPushUnique(vFanins,pGVar3);
          for (iVar = 0; iVar1 = Vec_PtrSize(vFanins), iVar < iVar1; iVar = iVar + 1) {
            pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(vFanins,iVar);
            pGVar3 = Gia_Regular(pGVar3);
            Cec2_ObjAddToFrontier(pGia,pGVar3,vFrontier,pSat);
          }
          Cec2_AddClausesMux(pGia,pObj_01,pSat);
        }
        iVar1 = Vec_PtrSize(vFanins);
        if (iVar1 < 2) {
          __assert_fail("Vec_PtrSize(vFanins) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x171,
                        "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
      }
      pGia_local._4_4_ = Cec2_ObjSatId(pGia,pObj_00);
    }
    else {
      iVar1 = satoko_add_variable(pSat,'\0');
      if (pGia->vVar2Obj != (Vec_Int_t *)0x0) {
        iVar2 = Vec_IntSize(pGia->vVar2Obj);
        if (iVar2 != iVar1) {
          __assert_fail("Vec_IntSize(pGia->vVar2Obj) == iVar",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x150,
                        "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
        Vec_IntPush(pGia->vVar2Obj,iObj);
      }
      pGia_local._4_4_ = Cec2_ObjSetSatId(pGia,pObj_00,iVar1);
    }
  }
  else {
    pGia_local._4_4_ = Cec2_ObjSatId(pGia,pObj_00);
  }
  return pGia_local._4_4_;
}

Assistant:

int Gia_ObjGetCnfVar( Gia_Man_t * pGia, int iObj, Vec_Ptr_t * vFrontier, Vec_Ptr_t * vFanins, satoko_t * pSat )
{ 
    Gia_Obj_t * pNode, * pFanin;
    Gia_Obj_t * pObj = Gia_ManObj(pGia, iObj);
    int i, k, fUseMuxes = 1;
    if ( Vec_IntSize(&pGia->vCopies2) < Gia_ManObjNum(pGia) )
        Vec_IntFillExtra( &pGia->vCopies2, Gia_ManObjNum(pGia), -1 );
    // quit if CNF is ready
    if ( Cec2_ObjSatId(pGia,pObj) >= 0 )
        return Cec2_ObjSatId(pGia,pObj);
    assert( iObj > 0 );
    if ( Gia_ObjIsCi(pObj) )
    {
        int iVar = satoko_add_variable(pSat, 0);
        if ( pGia->vVar2Obj )
        {
            assert( Vec_IntSize(pGia->vVar2Obj) == iVar );
            Vec_IntPush( pGia->vVar2Obj, iObj );
        }
        return Cec2_ObjSetSatId( pGia, pObj, iVar );
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    Vec_PtrClear( vFrontier );
    Cec2_ObjAddToFrontier( pGia, pObj, vFrontier, pSat );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec2_ObjSatId(pGia,pNode) >= 0 );
        if ( fUseMuxes && pNode->fMark0 )
        {
            Vec_PtrClear( vFanins );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesMux( pGia, pNode, pSat );
        }
        else
        {
            Cec2_CollectSuper( pGia, pNode, fUseMuxes, vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesSuper( pGia, pNode, vFanins, pSat ); 
            //printf( "%d ", Vec_PtrSize(vFanins) );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
    }
    return Cec2_ObjSatId(pGia,pObj);
}